

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O2

void __thiscall Refal2::CLeftPartCompiler::matchVE(CLeftPartCompiler *this,bool isRightDirection)

{
  CVariables *this_00;
  TVariableIndex TVar1;
  CVariable *pCVar2;
  code *pcVar3;
  undefined7 in_register_00000031;
  
  checkBorders(this);
  this_00 = &(this->super_CFunctionCompilerBase).variables;
  if ((int)CONCAT71(in_register_00000031,isRightDirection) != 0) {
    TVar1 = (((this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last)->
            super_CUnit).field_1.variable;
    pCVar2 = CVariables::GetVariable(this_00,TVar1);
    if (pCVar2->type == VT_E) {
      pcVar3 = COperationsBuilder::AddMatchRight_E;
    }
    else {
      pcVar3 = COperationsBuilder::AddMatchRight_V;
    }
    matchVariable(this,TVar1,(TMatchFunction)pcVar3);
    CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
    return;
  }
  TVar1 = (((this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.first)->
          super_CUnit).field_1.variable;
  pCVar2 = CVariables::GetVariable(this_00,TVar1);
  if (pCVar2->type == VT_E) {
    pcVar3 = COperationsBuilder::AddMatchLeft_E;
  }
  else {
    pcVar3 = COperationsBuilder::AddMatchLeft_V;
  }
  matchVariable(this,TVar1,(TMatchFunction)pcVar3);
  CNodeList<Refal2::CUnit>::RemoveFirst((CNodeList<Refal2::CUnit> *)this->hole);
  return;
}

Assistant:

void CLeftPartCompiler::matchVE(const bool isRightDirection)
{
	checkBorders();
	if( isRightDirection ) {
		TVariableIndex variableIndex = hole->GetLast()->Variable();

		if( variables.GetVariable( variableIndex ).TypeIs( VT_E ) ) {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchRight_E );
		} else {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchRight_V );
		}

		hole->RemoveLast();
	} else {
		TVariableIndex variableIndex = hole->GetFirst()->Variable();

		if( variables.GetVariable( variableIndex ).TypeIs( VT_E ) ) {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchLeft_E );
		} else {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchLeft_V );
		}

		hole->RemoveFirst();
	}
}